

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.cpp
# Opt level: O0

Light_SampleRes * embree::DirectionalLight_sample(Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  undefined8 uVar1;
  long in_RSI;
  Light_SampleRes *in_RDI;
  float fVar2;
  DirectionalLight *self;
  Light_SampleRes *res;
  Light_SampleRes *pLVar3;
  float local_388;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  pLVar3 = in_RDI;
  Light_SampleRes::Light_SampleRes(in_RDI);
  uVar1 = *(undefined8 *)(in_RSI + 0x38);
  *(undefined8 *)&(pLVar3->dir).field_0 = *(undefined8 *)(in_RSI + 0x30);
  *(undefined8 *)((long)&(pLVar3->dir).field_0 + 8) = uVar1;
  fVar2 = std::numeric_limits<float>::infinity();
  pLVar3->dist = fVar2;
  pLVar3->pdf = *(float *)(in_RSI + 0x54);
  if (*(float *)(in_RSI + 0x50) <= 0.9999999 && *(float *)(in_RSI + 0x50) != 0.9999999) {
    uniformSampleCone((float)((ulong)pLVar3 >> 0x20),(Vec2f *)in_RDI);
    local_168 = (float)*(undefined8 *)(in_RSI + 0x10);
    fStack_164 = (float)((ulong)*(undefined8 *)(in_RSI + 0x10) >> 0x20);
    fStack_160 = (float)*(undefined8 *)(in_RSI + 0x18);
    fStack_15c = (float)((ulong)*(undefined8 *)(in_RSI + 0x18) >> 0x20);
    local_38 = (float)local_2d8;
    fStack_34 = (float)((ulong)local_2d8 >> 0x20);
    fStack_30 = (float)uStack_2d0;
    fStack_2c = (float)((ulong)uStack_2d0 >> 0x20);
    *(ulong *)&(pLVar3->dir).field_0 =
         CONCAT44(local_388 * fStack_164 + fStack_34,local_388 * local_168 + local_38);
    *(ulong *)((long)&(pLVar3->dir).field_0 + 8) =
         CONCAT44(local_388 * fStack_15c + fStack_2c,local_388 * fStack_160 + fStack_30);
  }
  uVar1 = *(undefined8 *)(in_RSI + 0x48);
  *(undefined8 *)&(pLVar3->weight).field_0 = *(undefined8 *)(in_RSI + 0x40);
  *(undefined8 *)((long)&(pLVar3->weight).field_0 + 8) = uVar1;
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes DirectionalLight_sample(const Light* super,
                                                                     const DifferentialGeometry& dg,
                                                                     const Vec2f& s)
{
  const DirectionalLight* self = (DirectionalLight*)super;
  Light_SampleRes res;

  res.dir = self->frame.vz;
  res.dist = inf;
  res.pdf = self->pdf;

  if (self->cosAngle < COS_ANGLE_MAX)
    res.dir = self->frame * uniformSampleCone(self->cosAngle, s);

  res.weight = self->radiance; // *pdf/pdf cancel

  return res;
}